

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O3

void __thiscall Ptex::v2_2::PtexSeparableKernel::downresV(PtexSeparableKernel *this)

{
  int8_t *piVar1;
  uint uVar2;
  float *pfVar3;
  uint uVar4;
  float *pfVar5;
  uint uVar6;
  float *pfVar7;
  
  pfVar3 = this->kv;
  uVar2 = this->v;
  uVar4 = uVar2 & 1;
  uVar6 = this->vw - uVar4;
  pfVar5 = pfVar3 + uVar4;
  pfVar7 = pfVar5;
  if (1 < (int)uVar6) {
    uVar4 = (uVar6 >> 1) + 1;
    do {
      *pfVar5 = *pfVar7 + pfVar7[1];
      pfVar5 = pfVar5 + 1;
      pfVar7 = pfVar7 + 2;
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  if ((uVar6 & 1) != 0) {
    *pfVar5 = *pfVar7;
    pfVar5 = pfVar5 + 1;
  }
  this->v = (int)uVar2 / 2;
  this->vw = (int)((ulong)((long)pfVar5 - (long)pfVar3) >> 2);
  piVar1 = &(this->res).vlog2;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void downresV()
    {
        float* src = kv;
        float* dst = kv;

        // skip odd leading sample (if any)
        if (v & 1) {
            dst++;
            src++;
            vw--;
        }

        // combine even pairs
        for (int i = vw/2; i > 0; i--) {
            *dst++ = src[0] + src[1];
            src += 2;
        }

        // copy odd trailing sample (if any)
        if (vw & 1) {
            *dst++ = *src++;
        }

        // update state
        v /= 2;
        vw = int(dst - kv);
        res.vlog2--;
    }